

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_tuple_primitive_refSlotAt
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  size_t slotIndex;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  _Var1 = sysbvm_tuple_isNonNullPointer(*arguments);
  if (!_Var1) {
    sysbvm_error_nullArgument();
  }
  sVar2 = sysbvm_pointerLikeType_load(context,*arguments);
  slotIndex = sysbvm_tuple_anySize_decode(arguments[1]);
  sVar2 = sysbvm_tuple_slotAt(context,sVar2,slotIndex);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_refSlotAt(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);
    if(!sysbvm_tuple_isNonNullPointer(arguments[0])) sysbvm_error_nullArgument();

    return sysbvm_tuple_slotAt(context, sysbvm_pointerLikeType_load(context, arguments[0]), sysbvm_tuple_anySize_decode(arguments[1]));
}